

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  ushort uVar1;
  SrcList *pSVar2;
  Bitmask BVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  Bitmask BVar7;
  long lVar8;
  ulong uVar9;
  anon_union_8_2_996c0f8d_for_u1 *paVar10;
  
  uVar9 = 0;
  for (; pS != (Select *)0x0; pS = pS->pPrior) {
    pSVar2 = pS->pSrc;
    BVar3 = sqlite3WhereExprListUsage(pMaskSet,pS->pEList);
    BVar4 = sqlite3WhereExprListUsage(pMaskSet,pS->pGroupBy);
    BVar5 = sqlite3WhereExprListUsage(pMaskSet,pS->pOrderBy);
    BVar6 = sqlite3WhereExprUsage(pMaskSet,pS->pWhere);
    BVar7 = sqlite3WhereExprUsage(pMaskSet,pS->pHaving);
    uVar9 = BVar7 | uVar9 | BVar6 | BVar5 | BVar4 | BVar3;
    if (pSVar2 != (SrcList *)0x0) {
      paVar10 = &pSVar2->a[0].u1;
      for (lVar8 = 0; lVar8 < pSVar2->nSrc; lVar8 = lVar8 + 1) {
        BVar3 = exprSelectUsage(pMaskSet,(Select *)paVar10[-6].pFuncArg);
        uVar9 = BVar3 | uVar9;
        uVar1 = *(ushort *)((long)paVar10 + -0x1b);
        if ((uVar1 >> 10 & 1) == 0) {
          BVar3 = sqlite3WhereExprUsage
                            (pMaskSet,((anon_union_8_2_eeb63324_for_u3 *)(paVar10 + -2))->pOn);
          uVar9 = uVar9 | BVar3;
          uVar1 = *(ushort *)((long)paVar10 + -0x1b);
        }
        if ((uVar1 & 4) != 0) {
          BVar3 = sqlite3WhereExprListUsage(pMaskSet,paVar10->pFuncArg);
          uVar9 = uVar9 | BVar3;
        }
        paVar10 = paVar10 + 0xd;
      }
    }
  }
  return uVar9;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        mask |= exprSelectUsage(pMaskSet, pSrc->a[i].pSelect);
        if( pSrc->a[i].fg.isUsing==0 ){
          mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].u3.pOn);
        }
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}